

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O3

int xmlRelaxNGNextValue(xmlRelaxNGValidCtxtPtr ctxt)

{
  int *piVar1;
  void **ppvVar2;
  int iVar3;
  xmlRelaxNGPtr pxVar4;
  
  piVar1 = &ctxt->nbErrors;
  iVar3 = (int)piVar1;
  if ((*(long *)&ctxt->nbErrors != 0) && (ctxt->schema != (xmlRelaxNGPtr)0x0)) {
    pxVar4 = (xmlRelaxNGPtr)(*(long *)&ctxt->nbErrors + -1);
    do {
      ppvVar2 = &pxVar4->_private;
      pxVar4 = (xmlRelaxNGPtr)((long)&pxVar4->_private + 1);
    } while (*(char *)((long)ppvVar2 + 1) != '\0');
    while( true ) {
      if (pxVar4 == ctxt->schema) {
        *(undefined8 *)piVar1 = 0;
        return iVar3;
      }
      if (*(char *)&pxVar4->_private != '\0') break;
      pxVar4 = (xmlRelaxNGPtr)((long)&pxVar4->_private + 1);
    }
    *(xmlRelaxNGPtr *)piVar1 = pxVar4;
    return iVar3;
  }
  *(undefined8 *)piVar1 = 0;
  ctxt->schema = (xmlRelaxNGPtr)0x0;
  return iVar3;
}

Assistant:

static int
xmlRelaxNGNextValue(xmlRelaxNGValidCtxtPtr ctxt)
{
    xmlChar *cur;

    cur = ctxt->state->value;
    if ((cur == NULL) || (ctxt->state->endvalue == NULL)) {
        ctxt->state->value = NULL;
        ctxt->state->endvalue = NULL;
        return (0);
    }
    while (*cur != 0)
        cur++;
    while ((cur != ctxt->state->endvalue) && (*cur == 0))
        cur++;
    if (cur == ctxt->state->endvalue)
        ctxt->state->value = NULL;
    else
        ctxt->state->value = cur;
    return (0);
}